

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int scale;
  string rom;
  Platform platform;
  Chip8 chip8;
  int local_3b0c;
  undefined1 *local_3b08;
  long local_3b00;
  undefined1 local_3af8;
  undefined7 uStack_3af7;
  string local_3ae8;
  Platform local_3ac8;
  Chip8 local_3ab0;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter ROM file path: ",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  local_3b00 = 0;
  local_3af8 = 0;
  local_3b08 = &local_3af8;
  std::operator>>((istream *)&std::cin,(string *)&local_3b08);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Enter scale: ",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::istream::operator>>((istream *)&std::cin,&local_3b0c);
  Platform::Platform(&local_3ac8,"CHIP8 Interpreter",local_3b0c << 6,local_3b0c << 5,0x40,0x20);
  Chip8::Chip8(&local_3ab0);
  local_3ae8._M_dataplus._M_p = (pointer)&local_3ae8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3ae8,local_3b08,local_3b08 + local_3b00);
  Chip8::LoadGame(&local_3ab0,&local_3ae8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3ae8._M_dataplus._M_p != &local_3ae8.field_2) {
    operator_delete(local_3ae8._M_dataplus._M_p,local_3ae8.field_2._M_allocated_capacity + 1);
  }
  do {
    bVar1 = Platform::ProcessInput(&local_3ac8,local_3ab0.keys);
    Chip8::emulate(&local_3ab0);
    Platform::Update(&local_3ac8,local_3ab0.display,0x100);
  } while (!bVar1);
  Platform::~Platform(&local_3ac8);
  if (local_3b08 != &local_3af8) {
    operator_delete(local_3b08,CONCAT71(uStack_3af7,local_3af8) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    const unsigned int VIDEO_HEIGHT = 32;
    const unsigned int VIDEO_WIDTH = 64;

    std::cout << "Enter ROM file path: " << std::endl;
    std::string rom;
	std::cin >> rom;

    int scale;
    std::cout << "Enter scale: " << std::endl;
    std::cin >> scale;



	Platform platform("CHIP8 Interpreter", VIDEO_WIDTH * scale, VIDEO_HEIGHT * scale, VIDEO_WIDTH, VIDEO_HEIGHT);

	Chip8 chip8;
	chip8.LoadGame(rom);

	int videoPitch = sizeof(chip8.display[0]) * VIDEO_WIDTH;

	bool quit = false;

	while (!quit)
	{
		quit = platform.ProcessInput(chip8.keys);

			chip8.emulate();
			platform.Update(chip8.display, videoPitch);

	}

	return 0;
}